

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O2

void __thiscall
StringifyTest_DedupeSubstrings_Test::TestBody(StringifyTest_DedupeSubstrings_Test *this)

{
  long lVar1;
  char *message;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<wasm::SuffixTree::RepeatedSubstring> __l_01;
  undefined1 local_4d0 [8];
  Module wasm;
  uint local_d8 [2];
  undefined1 local_d0 [8];
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  substrings;
  Substrings result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashString;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined4 local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  internal local_48 [8];
  AssertionResult gtest_ar;
  allocator_type local_1b;
  allocator_type local_1a;
  allocator_type local_19;
  
  ::wasm::Module::Module((Module *)local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             "\n    (module\n      (func $a\n        (block $block_a\n          (drop (i32.const 20))\n          (drop (i32.const 10))\n        )\n        (block $block_b\n          (drop (if (result i32)\n            (i32.const 0)\n            (then (i32.const 40))\n            (else (i32.const 5))\n          ))\n        )\n        (block $block_c\n          (drop (if (result i32)\n            (i32.const 1)\n            (then (i32.const 30))\n          ))\n        )\n        (block $block_d\n          (drop (i32.const 20))\n          (drop (i32.const 10))\n        )\n        (block $block_e\n          (drop (if (result i32)\n            (i32.const 1)\n            (then (i32.const 30))\n          ))\n        )\n        (block $block_f\n          (drop (if (result i32)\n            (i32.const 0)\n            (then (i32.const 30))\n          ))\n        )\n      )\n    )\n  "
             ,(allocator<char> *)
              &result.
               super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PrintTest::parseWast
            (&this->super_StringifyTest,(Module *)local_4d0,
             (string *)
             &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  hashStringifyModule((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &result.
                       super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(Module *)local_4d0);
  ::wasm::StringifyProcessor::repeatSubstrings((vector *)local_d0);
  ::wasm::StringifyProcessor::dedupe
            ((vector *)
             &substrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x1c0000000c;
  __l._M_len = 2;
  __l._M_array = (iterator)&wasm.tagsMap._M_h._M_single_bucket;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__l,&local_1b);
  local_68 = 3;
  local_d8[0] = 0x17;
  local_d8[1] = 0x22;
  __l_00._M_len = 2;
  __l_00._M_array = local_d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__l_00,&local_1a);
  __l_01._M_len = 2;
  __l_01._M_array =
       (iterator)
       &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
            *)&gtest_ar.message_,__l_01,&local_19);
  testing::internal::
  CmpHelperEQ<std::vector<wasm::SuffixTree::RepeatedSubstring,std::allocator<wasm::SuffixTree::RepeatedSubstring>>,std::vector<wasm::SuffixTree::RepeatedSubstring,std::allocator<wasm::SuffixTree::RepeatedSubstring>>>
            (local_48,"result",
             "(std::vector<SuffixTree::RepeatedSubstring>{ SuffixTree::RepeatedSubstring{4u, (std::vector<unsigned>{12, 28})}, SuffixTree::RepeatedSubstring{3u, (std::vector<unsigned>{23, 34})}})"
             ,(vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
               *)&substrings.
                  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              *)&gtest_ar.message_);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&gtest_ar.message_);
  lVar1 = 0x28;
  do {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x18);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/stringify.cpp"
               ,0x132,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)
               &hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)CONCAT44(hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         hashString.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(hashString.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     hashString.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&substrings.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)local_d0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             &result.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::Module::~Module((Module *)local_4d0);
  return;
}

Assistant:

TEST_F(StringifyTest, DedupeSubstrings) {
  Module wasm;
  parseWast(wasm, dupModuleText);
  auto hashString = hashStringifyModule(&wasm);
  std::vector<SuffixTree::RepeatedSubstring> substrings =
    StringifyProcessor::repeatSubstrings(hashString);
  auto result = StringifyProcessor::dedupe(substrings);

  EXPECT_EQ(
    result,
    (std::vector<SuffixTree::RepeatedSubstring>{
      // 5, 6, 7, 6 appears at idx 12 and again at 28
      SuffixTree::RepeatedSubstring{4u, (std::vector<unsigned>{12, 28})},
      // 10, 11, 6 appears at idx 23 and again at 34
      SuffixTree::RepeatedSubstring{3u, (std::vector<unsigned>{23, 34})}}));
}